

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O2

void __thiscall
CoreML::TreeEnsembleBase::setDefaultPredictionValue
          (TreeEnsembleBase *this,vector<double,_std::allocator<double>_> *v)

{
  double *pdVar1;
  double *pdVar2;
  
  (this->tree_parameters->basepredictionvalue_).current_size_ = 0;
  pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (pdVar2 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
    Specification::TreeEnsembleParameters::add_basepredictionvalue(this->tree_parameters,*pdVar2);
  }
  this->tree_parameters->numpredictiondimensions_ =
       (long)(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start >> 3;
  return;
}

Assistant:

void TreeEnsembleBase::setDefaultPredictionValue(const std::vector<double>& v) {
        tree_parameters->clear_basepredictionvalue();
        for(double e : v) {
            tree_parameters->add_basepredictionvalue(e);
        }

        tree_parameters->set_numpredictiondimensions(v.size());
    }